

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u8(CBS *cbs,uint8_t *out)

{
  uint8_t *puVar1;
  
  if (cbs->len != 0) {
    puVar1 = cbs->data;
    cbs->data = puVar1 + 1;
    cbs->len = cbs->len - 1;
    *out = *puVar1;
    return 1;
  }
  return 0;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}